

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool mi_manage_os_memory_ex
                (void *start,size_t size,_Bool is_committed,_Bool is_large,_Bool is_zero,
                int numa_node,_Bool exclusive,mi_arena_id_t *arena_id)

{
  mi_memid_t memid_00;
  _Bool _Var1;
  undefined1 in_stack_00000008;
  undefined7 in_stack_00000009;
  _Bool in_stack_00000017;
  int in_stack_00000018;
  _Bool in_stack_0000001f;
  size_t in_stack_00000020;
  void *in_stack_00000028;
  mi_memid_t memid;
  undefined1 in_stack_00000054;
  undefined8 in_stack_ffffffffffffffa0;
  
  _mi_memid_create((mi_memkind_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  memid_00.mem.os.size._7_1_ = exclusive;
  memid_00.mem._0_15_ = stack0x00000040;
  memid_00._16_4_ = numa_node;
  memid_00.memkind._0_1_ = in_stack_00000054;
  memid_00.memkind._1_1_ = is_zero;
  memid_00.memkind._2_1_ = is_large;
  memid_00.memkind._3_1_ = is_committed;
  _Var1 = mi_manage_os_memory_ex2
                    (in_stack_00000028,in_stack_00000020,in_stack_0000001f,in_stack_00000018,
                     in_stack_00000017,memid_00,
                     (mi_arena_id_t *)CONCAT71(in_stack_00000009,in_stack_00000008));
  return _Var1;
}

Assistant:

bool mi_manage_os_memory_ex(void* start, size_t size, bool is_committed, bool is_large, bool is_zero, int numa_node, bool exclusive, mi_arena_id_t* arena_id) mi_attr_noexcept {
  mi_memid_t memid = _mi_memid_create(MI_MEM_EXTERNAL);
  memid.initially_committed = is_committed;
  memid.initially_zero = is_zero;
  memid.is_pinned = is_large;
  return mi_manage_os_memory_ex2(start,size,is_large,numa_node,exclusive,memid, arena_id);
}